

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int getCoreTemp(void)

{
  int iVar1;
  char *pcVar2;
  char buffer [256];
  int max_buffer;
  FILE *stream;
  float temp;
  char acStack_118 [260];
  undefined4 local_14;
  FILE *local_10;
  float local_4;
  
  local_4 = 0.0;
  local_14 = 0x100;
  local_10 = popen("/opt/vc/bin/vcgencmd measure_temp 2>&1","r");
  if (local_10 != (FILE *)0x0) {
    while (iVar1 = feof(local_10), iVar1 == 0) {
      pcVar2 = fgets(acStack_118,0x100,local_10);
      if (pcVar2 != (char *)0x0) {
        __isoc99_sscanf(acStack_118,"temp=%f\'C",&local_4);
      }
    }
    pclose(local_10);
  }
  return (int)local_4 + -0x1e;
}

Assistant:

int getCoreTemp()
{
	float temp = 0.;
    FILE * stream;
    const int max_buffer = 256;
    char buffer[max_buffer];
    
    stream = popen("/opt/vc/bin/vcgencmd measure_temp 2>&1", "r");	
    if (stream) {
		while (!feof(stream))
			if (fgets(buffer, max_buffer, stream) != NULL) 
			{					
				sscanf(buffer, "temp=%f'C", &temp);				
			}
		pclose(stream);
    }
    return ((int)temp - 30);
}